

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_282016::PeerManagerImpl::PrepareBlockFilterRequest
          (PeerManagerImpl *this,CNode *node,Peer *peer,BlockFilterType filter_type,
          uint32_t start_height,uint256 *stop_hash,uint32_t max_height_diff,CBlockIndex **stop_index
          ,BlockFilterIndex **filter_index)

{
  uint uVar1;
  CBlockIndex **ppCVar2;
  BlockFilterIndex **ppBVar3;
  bool bVar4;
  CBlockIndex *pindex;
  Logger *pLVar5;
  BlockFilterIndex *pBVar6;
  string *args;
  undefined7 in_register_00000009;
  int source_line;
  long in_FS_OFFSET;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  char *fmt;
  uint32_t *args_1;
  unique_lock<std::recursive_mutex> *this_00;
  NodeId local_70;
  uint32_t start_height_local;
  uint32_t stop_height;
  undefined4 uStack_5c;
  bool local_58;
  string local_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  start_height_local = start_height;
  if (((int)CONCAT71(in_register_00000009,filter_type) != 0) ||
     ((peer->m_our_services & NODE_COMPACT_FILTERS) == NODE_NONE)) {
    pLVar5 = LogInstance();
    bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar5,NET,Debug);
    if (bVar4) {
      local_50._M_dataplus._M_p = (pointer)node->id;
      _stop_height = (RecursiveMutex *)CONCAT71(stack0xffffffffffffffa1,filter_type);
      logging_function._M_str = "PrepareBlockFilterRequest";
      logging_function._M_len = 0x19;
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
      ;
      source_file._M_len = 0x62;
      LogPrintFormatInternal<long,unsigned_char>
                (logging_function,source_file,0xd7e,NET,Debug,(ConstevalFormatString<2U>)0x7ea249,
                 (long *)&local_50,(uchar *)&stop_height);
    }
    goto LAB_001e36bd;
  }
  _stop_height = &cs_main;
  local_58 = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)&stop_height);
  pindex = ::node::BlockManager::LookupBlockIndex(&this->m_chainman->m_blockman,stop_hash);
  ppCVar2 = stop_index;
  *stop_index = pindex;
  if (pindex == (CBlockIndex *)0x0) {
LAB_001e36ca:
    pLVar5 = LogInstance();
    bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar5,NET,Debug);
    if (bVar4) {
      local_70 = node->id;
      base_blob<256u>::ToString_abi_cxx11_(&local_50,stop_hash);
      logging_function_00._M_str = "PrepareBlockFilterRequest";
      logging_function_00._M_len = 0x19;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
      ;
      source_file_00._M_len = 0x62;
      LogPrintFormatInternal<long,std::__cxx11::string>
                (logging_function_00,source_file_00,0xd8a,NET,Debug,
                 (ConstevalFormatString<2U>)0x7ea27e,&local_70,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    LOCK();
    (node->fDisconnect)._M_base._M_i = true;
    UNLOCK();
    std::unique_lock<std::recursive_mutex>::~unique_lock
              ((unique_lock<std::recursive_mutex> *)&stop_height);
  }
  else {
    bVar4 = BlockRequestAllowed(this,pindex);
    if (!bVar4) goto LAB_001e36ca;
    this_00 = (unique_lock<std::recursive_mutex> *)&stop_height;
    std::unique_lock<std::recursive_mutex>::~unique_lock(this_00);
    ppBVar3 = filter_index;
    uVar1 = (*ppCVar2)->nHeight;
    _stop_height = (RecursiveMutex *)CONCAT44(uStack_5c,uVar1);
    if (uVar1 < start_height_local) {
      pLVar5 = LogInstance();
      bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar5,NET,Debug);
      if (bVar4) {
        local_50._M_dataplus._M_p = (pointer)node->id;
        args_1 = &start_height_local;
        source_line = 0xd94;
        fmt = 
        "peer %d sent invalid getcfilters/getcfheaders with start height %d and stop height %d\n";
LAB_001e389f:
        logging_function_02._M_str = "PrepareBlockFilterRequest";
        logging_function_02._M_len = 0x19;
        source_file_02._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_02._M_len = 0x62;
        LogPrintFormatInternal<long,unsigned_int,unsigned_int>
                  (logging_function_02,source_file_02,source_line,NET,Debug,
                   (ConstevalFormatString<3U>)fmt,(long *)&local_50,args_1,(uint *)this_00);
      }
LAB_001e36bd:
      LOCK();
      (node->fDisconnect)._M_base._M_i = true;
      UNLOCK();
    }
    else {
      if (max_height_diff <= uVar1 - start_height_local) {
        pLVar5 = LogInstance();
        bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar5,NET,Debug);
        if (bVar4) {
          local_50._M_dataplus._M_p = (pointer)node->id;
          args_1 = (uint32_t *)&local_70;
          local_70 = CONCAT44(local_70._4_4_,(stop_height - start_height_local) + 1);
          this_00 = (unique_lock<std::recursive_mutex> *)&max_height_diff;
          source_line = 0xd9a;
          fmt = "peer %d requested too many cfilters/cfheaders: %d / %d\n";
          goto LAB_001e389f;
        }
        goto LAB_001e36bd;
      }
      pBVar6 = GetBlockFilterIndex(filter_type);
      *ppBVar3 = pBVar6;
      bVar4 = true;
      if (pBVar6 != (BlockFilterIndex *)0x0) goto LAB_001e3770;
      pLVar5 = LogInstance();
      bVar4 = BCLog::Logger::WillLogCategoryLevel(pLVar5,NET,Debug);
      if (bVar4) {
        args = BlockFilterTypeName_abi_cxx11_(filter_type);
        logging_function_01._M_str = "PrepareBlockFilterRequest";
        logging_function_01._M_len = 0x19;
        source_file_01._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net_processing.cpp"
        ;
        source_file_01._M_len = 0x62;
        LogPrintFormatInternal<std::__cxx11::string>
                  (logging_function_01,source_file_01,0xda1,NET,Debug,
                   (ConstevalFormatString<1U>)0x7ea337,args);
      }
    }
  }
  bVar4 = false;
LAB_001e3770:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool PeerManagerImpl::PrepareBlockFilterRequest(CNode& node, Peer& peer,
                                                BlockFilterType filter_type, uint32_t start_height,
                                                const uint256& stop_hash, uint32_t max_height_diff,
                                                const CBlockIndex*& stop_index,
                                                BlockFilterIndex*& filter_index)
{
    const bool supported_filter_type =
        (filter_type == BlockFilterType::BASIC &&
         (peer.m_our_services & NODE_COMPACT_FILTERS));
    if (!supported_filter_type) {
        LogDebug(BCLog::NET, "peer %d requested unsupported block filter type: %d\n",
                 node.GetId(), static_cast<uint8_t>(filter_type));
        node.fDisconnect = true;
        return false;
    }

    {
        LOCK(cs_main);
        stop_index = m_chainman.m_blockman.LookupBlockIndex(stop_hash);

        // Check that the stop block exists and the peer would be allowed to fetch it.
        if (!stop_index || !BlockRequestAllowed(stop_index)) {
            LogDebug(BCLog::NET, "peer %d requested invalid block hash: %s\n",
                     node.GetId(), stop_hash.ToString());
            node.fDisconnect = true;
            return false;
        }
    }

    uint32_t stop_height = stop_index->nHeight;
    if (start_height > stop_height) {
        LogDebug(BCLog::NET, "peer %d sent invalid getcfilters/getcfheaders with "
                 "start height %d and stop height %d\n",
                 node.GetId(), start_height, stop_height);
        node.fDisconnect = true;
        return false;
    }
    if (stop_height - start_height >= max_height_diff) {
        LogDebug(BCLog::NET, "peer %d requested too many cfilters/cfheaders: %d / %d\n",
                 node.GetId(), stop_height - start_height + 1, max_height_diff);
        node.fDisconnect = true;
        return false;
    }

    filter_index = GetBlockFilterIndex(filter_type);
    if (!filter_index) {
        LogDebug(BCLog::NET, "Filter index for supported type %s not found\n", BlockFilterTypeName(filter_type));
        return false;
    }

    return true;
}